

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O0

int DoGetCVar(FBaseCVar *cvar,bool is_string)

{
  int iVar1;
  float fVar2;
  undefined4 extraout_var;
  UCVarValue val;
  bool is_string_local;
  FBaseCVar *cvar_local;
  
  if (cvar == (FBaseCVar *)0x0) {
    cvar_local._4_4_ = 0;
  }
  else if (is_string) {
    iVar1 = (*cvar->_vptr_FBaseCVar[4])(cvar,3);
    cvar_local._4_4_ =
         ACSStringPool::AddString(&GlobalACSStrings,(char *)CONCAT44(extraout_var,iVar1));
  }
  else {
    iVar1 = (*cvar->_vptr_FBaseCVar[2])();
    if (iVar1 == 2) {
      fVar2 = (float)(*cvar->_vptr_FBaseCVar[4])(cvar,2);
      cvar_local._4_4_ = DoubleToACS((double)fVar2);
    }
    else {
      cvar_local._4_4_ = (*cvar->_vptr_FBaseCVar[4])(cvar,1);
    }
  }
  return cvar_local._4_4_;
}

Assistant:

static int DoGetCVar(FBaseCVar *cvar, bool is_string)
{
	UCVarValue val;

	if (cvar == nullptr)
	{
		return 0;
	}
	else if (is_string)
	{
		val = cvar->GetGenericRep(CVAR_String);
		return GlobalACSStrings.AddString(val.String);
	}
	else if (cvar->GetRealType() == CVAR_Float)
	{
		val = cvar->GetGenericRep(CVAR_Float);
		return DoubleToACS(val.Float);
	}
	else
	{
		val = cvar->GetGenericRep(CVAR_Int);
		return val.Int;
	}
}